

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O1

unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true> __thiscall
duckdb::AtClause::Deserialize(AtClause *this,Deserializer *deserializer)

{
  int iVar1;
  AtClause *this_00;
  ParsedExpression *pPVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> unit;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined1 uStack_70;
  undefined4 uStack_6f;
  undefined2 uStack_6b;
  undefined1 uStack_69;
  undefined1 local_68 [48];
  undefined1 local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,1,"unit");
  if ((char)iVar1 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_68[0x10] = 0;
    local_88 = &local_78;
    local_78 = 0;
    uStack_77 = (undefined7)local_68._17_8_;
    uStack_70 = SUB81(local_68._17_8_,7);
    uStack_6f = local_68._25_4_;
    uStack_6b = local_68._29_2_;
    uStack_69 = local_68[0x1f];
    local_80 = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_88,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,2,"expr");
  pPVar2 = (ParsedExpression *)0x0;
  if ((char)iVar1 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      pPVar2 = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)local_68,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      pPVar2 = (ParsedExpression *)local_68._0_8_;
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00 = (AtClause *)operator_new(0x28);
  if (local_88 == &local_78) {
    uStack_30 = CONCAT17(uStack_69,CONCAT25(uStack_6b,CONCAT41(uStack_6f,uStack_70)));
    local_68._32_8_ = &local_38;
  }
  else {
    local_68._32_8_ = local_88;
  }
  uStack_37 = uStack_77;
  local_38 = local_78;
  local_68._40_8_ = local_80;
  local_80 = 0;
  local_78 = 0;
  local_90._M_head_impl = pPVar2;
  local_88 = &local_78;
  AtClause(this_00,(string *)(local_68 + 0x20),
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            *)&local_90);
  (this->unit)._M_dataplus._M_p = (pointer)this_00;
  if (local_90._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_90._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_90._M_head_impl = (ParsedExpression *)0x0;
  if ((undefined1 *)local_68._32_8_ != &local_38) {
    operator_delete((void *)local_68._32_8_);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  return (unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)
         (unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)this;
}

Assistant:

unique_ptr<AtClause> AtClause::Deserialize(Deserializer &deserializer) {
	auto unit = deserializer.ReadPropertyWithDefault<string>(1, "unit");
	auto expr = deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(2, "expr");
	auto result = duckdb::unique_ptr<AtClause>(new AtClause(std::move(unit), std::move(expr)));
	return result;
}